

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::add<wasm::Type,wasm::Type,wasm::Type>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,Type option,Type rest,Type rest_1,
          Type rest_2)

{
  iterator __position;
  vector<wasm::Type,std::allocator<wasm::Type>> *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  Type local_40;
  Type option_local;
  FeatureSet feature_local;
  
  local_40.id = option.id;
  option_local.id._4_4_ = feature.features;
  this_00 = (vector<wasm::Type,std::allocator<wasm::Type>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&option_local.id + 4));
  __position._M_current = *(Type **)(this_00 + 8);
  if (__position._M_current == *(Type **)(this_00 + 0x10)) {
    std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
              (this_00,__position,&local_40);
  }
  else {
    (__position._M_current)->id = option.id;
    *(Type **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::Type,wasm::Type>(this,option_local.id._4_4_,rest,rest_1,rest_2);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }